

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

void __thiscall
ot::commissioner::coap::Coap::ReceiveMessage
          (Coap *this,Endpoint *aEndpoint,shared_ptr<ot::commissioner::coap::Message> *aMessage,
          Error *error)

{
  char cVar1;
  Request *aResponse;
  char *from;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *to;
  string_view fmt;
  format_args args;
  writer write;
  writer local_b0;
  string local_a8;
  string local_88;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  if (error->mCode == kNone) {
    aResponse = (aMessage->
                super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
    if (aResponse == (Request *)0x0) {
      __assert_fail("condition",
                    "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap.cpp"
                    ,0x277,
                    "void ot::commissioner::coap::Coap::ReceiveMessage(Endpoint &, std::shared_ptr<Message>, Error)"
                   );
    }
    aResponse->mEndpoint = aEndpoint;
    if ((byte)((aResponse->mHeader).mCode - 1) < 4) {
      HandleRequest(this,aResponse);
      return;
    }
    HandleResponse(this,aResponse);
    return;
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"coap","");
  local_68.types_[0] = string_type;
  from = "drop a CoAP message in bad format: {}";
  local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
       "drop a CoAP message in bad format: {}";
  local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x25;
  local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
  local_68.context_.super_basic_format_parse_context<char>._20_4_ = 1;
  local_68.parse_funcs_[0] =
       ::fmt::v10::detail::
       parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
  local_b0.handler_ = &local_68;
  local_68.context_.types_ = local_68.types_;
  do {
    cVar1 = *from;
    to = from;
    while (cVar1 != '{') {
      to = to + 1;
      if (to == "") {
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()(&local_b0,from,"");
        goto LAB_001f6277;
      }
      cVar1 = *to;
    }
    ::fmt::v10::detail::
    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::writer::operator()(&local_b0,from,to);
    from = ::fmt::v10::detail::
           parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                     (to,"",&local_68);
  } while (from != "");
LAB_001f6277:
  local_68._0_8_ = (error->mMessage)._M_dataplus._M_p;
  local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
       (char *)(error->mMessage)._M_string_length;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x25;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_68;
  ::fmt::v10::vformat_abi_cxx11_(&local_88,(v10 *)"drop a CoAP message in bad format: {}",fmt,args);
  Log(kInfo,&local_a8,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return;
}

Assistant:

Error Message::GetOption(ByteArray &aValue, OptionType aNumber) const
{
    Error error;
    auto  option = GetOption(aNumber);

    VerifyOrExit(option != nullptr, error = ERROR_NOT_FOUND("CoAP option {} not found", aNumber));

    aValue = option->GetOpaqueValue();

exit:
    return error;
}